

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

void helper_lswx_ppc64(CPUPPCState_conflict2 *env,target_ulong addr,uint32_t reg,uint32_t ra,
                      uint32_t rb)

{
  _Bool _Var1;
  int nregs;
  uintptr_t unaff_retaddr;
  _Bool local_29;
  int num_used_regs;
  uint32_t rb_local;
  uint32_t ra_local;
  uint32_t reg_local;
  target_ulong addr_local;
  CPUPPCState_conflict2 *env_local;
  
  if ((env->xer & 0x7f) == 0) {
    return;
  }
  nregs = (int)((env->xer & 0x7f) + 3 >> 2);
  if (ra != 0) {
    _Var1 = lsw_reg_in_range(reg,nregs,ra);
    local_29 = true;
    if (_Var1) goto LAB_0102662c;
  }
  local_29 = lsw_reg_in_range(reg,nregs,rb);
LAB_0102662c:
  if (local_29 == false) {
    do_lsw(env,addr,(uint)env->xer & 0x7f,reg,unaff_retaddr);
    return;
  }
  raise_exception_err_ra_ppc64(env,6,0x22,unaff_retaddr);
}

Assistant:

void helper_lswx(CPUPPCState *env, target_ulong addr, uint32_t reg,
                 uint32_t ra, uint32_t rb)
{
    if (likely(xer_bc != 0)) {
        int num_used_regs = DIV_ROUND_UP(xer_bc, 4);
        if (unlikely((ra != 0 && lsw_reg_in_range(reg, num_used_regs, ra)) ||
                     lsw_reg_in_range(reg, num_used_regs, rb))) {
            raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                                   POWERPC_EXCP_INVAL |
                                   POWERPC_EXCP_INVAL_LSWX, GETPC());
        } else {
            do_lsw(env, addr, xer_bc, reg, GETPC());
        }
    }
}